

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_2::detail::
lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
::skip_bom(lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
           *this)

{
  char_int_type cVar1;
  undefined1 local_21;
  lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
  *this_local;
  
  cVar1 = get(this);
  if (cVar1 == 0xef) {
    cVar1 = get(this);
    local_21 = false;
    if (cVar1 == 0xbb) {
      cVar1 = get(this);
      local_21 = cVar1 == 0xbf;
    }
    this_local._7_1_ = local_21;
  }
  else {
    unget(this);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool skip_bom()
    {
        if (get() == 0xEF)
        {
            // check if we completely parse the BOM
            return get() == 0xBB && get() == 0xBF;
        }

        // the first character is not the beginning of the BOM; unget it to
        // process is later
        unget();
        return true;
    }